

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValuesConstraint.h
# Opt level: O2

void __thiscall
TCLAP::
ValuesConstraint<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
ValuesConstraint(ValuesConstraint<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *this,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *allowed)

{
  string *this_00;
  uint uVar1;
  ulong uVar2;
  string temp;
  ostringstream os;
  string asStack_1c8 [32];
  allocator local_1a8 [376];
  
  (this->
  super_Constraint<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  )._vptr_Constraint = (_func_int **)&PTR_description_0011c9f8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->_allowed,allowed);
  this_00 = &this->_typeDesc;
  std::__cxx11::string::string((string *)this_00,"",local_1a8);
  for (uVar1 = 0; uVar2 = (ulong)uVar1,
      uVar2 < (ulong)((long)(this->_allowed).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->_allowed).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5); uVar1 = uVar1 + 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::operator<<((ostream *)local_1a8,
                    (string *)
                    ((this->_allowed).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar2));
    std::__cxx11::stringbuf::str();
    if (uVar2 != 0) {
      std::__cxx11::string::append((char *)this_00);
    }
    std::__cxx11::string::append((string *)this_00);
    std::__cxx11::string::~string(asStack_1c8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  }
  return;
}

Assistant:

ValuesConstraint<T>::ValuesConstraint(std::vector<T>& allowed)
: _allowed(allowed),
  _typeDesc("")
{ 
    for ( unsigned int i = 0; i < _allowed.size(); i++ )
    {
        std::ostringstream os;
        os << _allowed[i];

        std::string temp( os.str() ); 

        if ( i > 0 )
			_typeDesc += "|";
        _typeDesc += temp;
    }
}